

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QListView::resizeEvent(QListView *this,QResizeEvent *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QAbstractItemViewPrivate *this_00;
  State SVar6;
  char cVar7;
  
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (this_00->delayedPendingLayout == false) {
    iVar1 = *(int *)(e + 0x10);
    iVar2 = *(int *)(e + 0x14);
    iVar3 = *(int *)(e + 0x18);
    iVar4 = *(int *)(e + 0x1c);
    if (iVar2 != iVar4 || iVar1 != iVar3) {
      if (*(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                   super_QWidgetPrivate.field_0x28 == 0) {
        cVar7 = this_00->wrapItemText;
      }
      else {
        cVar7 = '\0';
      }
      iVar5 = *(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                       super_QWidgetPrivate.field_0x18;
      if ((cVar7 == '\0') &&
         ((SVar6 = QAbstractItemView::state((QAbstractItemView *)this), SVar6 != NoState ||
          ((iVar1 == iVar3 || iVar5 != 0) && (iVar2 == iVar4 || iVar5 != 1) ||
           *(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                    super_QWidgetPrivate.field_0x20 != 1)))) {
        QAbstractItemView::resizeEvent((QAbstractItemView *)this,e);
        return;
      }
      QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,100);
      return;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }